

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

int32_t __thiscall
xla::GraphCycles::ContractEdge(GraphCycles *this,int32_t a,int32_t b,bool *success)

{
  pointer pNVar1;
  pointer piVar2;
  pointer piVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  int32_t y;
  int32_t value;
  OrderedNodeSet *this_00;
  pointer piVar7;
  int *piVar8;
  int32_t b_local;
  OrderedNodeSet in;
  OrderedNodeSet out;
  
  b_local = b;
  bVar4 = HasEdge(this,a,b);
  if (!bVar4) {
    __assert_fail("HasEdge(a, b) && \"No edge exists from a to b\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/xla/graphcycles.cc"
                  ,0x1bc,"int32_t xla::GraphCycles::ContractEdge(int32_t, int32_t, bool &)");
  }
  RemoveEdge(this,a,b);
  bVar4 = IsReachableNonConst(this,a,b);
  if (bVar4) {
    InsertEdge(this,a,b);
    *success = false;
    y = -1;
  }
  else {
    lVar5 = (long)b;
    pNVar1 = (this->rep_->node_io_).
             super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)a;
    value = b;
    y = a;
    if ((ulong)(((long)*(pointer *)
                        ((long)&pNVar1[lVar6].out.value_sequence_.
                                super__Vector_base<int,_std::allocator<int>_> + 8) -
                 *(long *)&pNVar1[lVar6].out.value_sequence_.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl >> 2) +
               ((long)*(pointer *)
                       ((long)&pNVar1[lVar6].in.value_sequence_.
                               super__Vector_base<int,_std::allocator<int>_> + 8) -
                *(long *)&pNVar1[lVar6].in.value_sequence_.
                          super__Vector_base<int,_std::allocator<int>_> >> 2)) <
        (ulong)(((long)*(pointer *)
                        ((long)&pNVar1[lVar5].out.value_sequence_.
                                super__Vector_base<int,_std::allocator<int>_> + 8) -
                 *(long *)&pNVar1[lVar5].out.value_sequence_.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl >> 2) +
               ((long)*(pointer *)
                       ((long)&pNVar1[lVar5].in.value_sequence_.
                               super__Vector_base<int,_std::allocator<int>_> + 8) -
                *(long *)&pNVar1[lVar5].in.value_sequence_.
                          super__Vector_base<int,_std::allocator<int>_> >> 2))) {
      lVar5 = lVar6;
      value = a;
      y = b;
      b_local = a;
    }
    OrderedSet<int>::OrderedSet(&out,&pNVar1[lVar5].out);
    OrderedSet<int>::OrderedSet(&in,&pNVar1[lVar5].in);
    piVar3 = out.value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar7 = out.value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar2 = in.value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,
        piVar8 = in.value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start, piVar7 != piVar3; piVar7 = piVar7 + 1) {
      OrderedSet<int>::Erase
                (&(this->rep_->node_io_).
                  super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                  ._M_impl.super__Vector_impl_data._M_start[*piVar7].in,value);
    }
    for (; piVar8 != piVar2; piVar8 = piVar8 + 1) {
      OrderedSet<int>::Erase
                (&(this->rep_->node_io_).
                  super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                  ._M_impl.super__Vector_impl_data._M_start[*piVar8].out,value);
    }
    std::vector<int,_std::allocator<int>_>::push_back(&this->rep_->free_nodes_,&b_local);
    pNVar1 = (this->rep_->node_io_).
             super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this_00 = &pNVar1[y].out;
    OrderedSet<int>::Reserve
              (this_00,((long)out.value_sequence_.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)out.value_sequence_.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2) +
                       ((long)*(pointer *)
                               ((long)&pNVar1[y].out.value_sequence_.
                                       super__Vector_base<int,_std::allocator<int>_> + 8) -
                        (long)(this_00->value_sequence_).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2));
    for (; out.value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start !=
           out.value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
        out.value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             out.value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + 1) {
      InsertEdge(this,y,*out.value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
    }
    pNVar1 = (this->rep_->node_io_).
             super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ._M_impl.super__Vector_impl_data._M_start;
    OrderedSet<int>::Reserve
              (&pNVar1[y].in,
               ((long)in.value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)in.value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) +
               ((long)*(pointer *)
                       ((long)&pNVar1[y].in.value_sequence_.
                               super__Vector_base<int,_std::allocator<int>_> + 8) -
                *(long *)&pNVar1[y].in.value_sequence_.super__Vector_base<int,_std::allocator<int>_>
               >> 2));
    for (; in.value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start !=
           in.value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
        in.value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             in.value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + 1) {
      InsertEdge(this,*in.value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,y);
    }
    *success = true;
    OrderedSet<int>::~OrderedSet(&in);
    OrderedSet<int>::~OrderedSet(&out);
  }
  return y;
}

Assistant:

int32_t GraphCycles::ContractEdge(int32_t a, int32_t b, bool &success) {
  assert(HasEdge(a, b) && "No edge exists from a to b");
  RemoveEdge(a, b);

  if (IsReachableNonConst(a, b)) {
    // Restore the graph to its original state.
    InsertEdge(a, b);
    success = false;
    return -1;
  }

  if (rep_->node_io_[b].in.Size() + rep_->node_io_[b].out.Size() >
      rep_->node_io_[a].in.Size() + rep_->node_io_[a].out.Size()) {
    // Swap "a" and "b" to minimize copying.
    std::swap(a, b);
  }

  NodeIO* nb_io = &rep_->node_io_[b];
  OrderedNodeSet out = std::move(nb_io->out);
  OrderedNodeSet in = std::move(nb_io->in);
  for (int32_t y : out.GetSequence()) {
    rep_->node_io_[y].in.Erase(b);
  }
  for (int32_t y : in.GetSequence()) {
    rep_->node_io_[y].out.Erase(b);
  }
  rep_->free_nodes_.push_back(b);

  rep_->node_io_[a].out.Reserve(rep_->node_io_[a].out.Size() + out.Size());
  for (int32_t y : out.GetSequence()) {
    InsertEdge(a, y);
  }

  rep_->node_io_[a].in.Reserve(rep_->node_io_[a].in.Size() + in.Size());
  for (int32_t y : in.GetSequence()) {
    InsertEdge(y, a);
  }

  // Note, if the swap happened it might be what originally was called "b".
  success = true;
  return a;
}